

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O2

void __thiscall
luna::Exception::SetWhat<char_const*&,char,int&,char,char_const(&)[45]>
          (Exception *this,char **args,char *args_1,int *args_2,char *args_3,char (*args_4) [45])

{
  ostringstream oss;
  string local_1c8 [32];
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  SetWhat<char_const*&,char,int&,char,char_const(&)[45]>
            (this,(ostringstream *)local_1a8,args,args_1,args_2,args_3,args_4);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)this,local_1c8);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return;
}

Assistant:

void SetWhat(Args&&... args)
        {
            std::ostringstream oss;
            SetWhat(oss, std::forward<Args>(args)...);
            what_ = oss.str();
        }